

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void init_wedge_master_masks(void)

{
  uint8_t uVar1;
  int mskx;
  int msk;
  int shift;
  int stride;
  int h;
  int w;
  int j;
  int i;
  uint8_t *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_8;
  int local_4;
  
  for (local_4 = 0; local_4 < 0x40; local_4 = local_4 + 2) {
    shift_copy((uint8_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,0,0x49caa6);
    shift_copy((uint8_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,0,0x49cae3);
    memcpy(wedge_mask_obl[0][1] + (local_4 << 6),"",0x40);
    memcpy(wedge_mask_obl[0][1] + (local_4 + 1) * 0x40,"",0x40);
  }
  for (local_4 = 0; local_4 < 0x40; local_4 = local_4 + 1) {
    for (local_8 = 0; local_8 < 0x40; local_8 = local_8 + 1) {
      uVar1 = wedge_mask_obl[0][3][local_4 * 0x40 + local_8];
      wedge_mask_obl[0][2][local_8 * 0x40 + local_4] = uVar1;
      wedge_mask_obl[0][5][(0x3f - local_8) * 0x40 + local_4] = '@' - uVar1;
      wedge_mask_obl[0][4][(local_4 * 0x40 + 0x3f) - local_8] = '@' - uVar1;
      wedge_mask_obl[1][2][local_8 * 0x40 + local_4] = '@' - uVar1;
      wedge_mask_obl[1][3][local_4 * 0x40 + local_8] = '@' - uVar1;
      wedge_mask_obl[1][5][(0x3f - local_8) * 0x40 + local_4] = uVar1;
      wedge_mask_obl[1][4][(local_4 * 0x40 + 0x3f) - local_8] = uVar1;
      uVar1 = wedge_mask_obl[0][1][local_4 * 0x40 + local_8];
      wedge_mask_obl[0][0][local_8 * 0x40 + local_4] = uVar1;
      uVar1 = '@' - uVar1;
      wedge_mask_obl[1][0][local_8 * 0x40 + local_4] = uVar1;
      wedge_mask_obl[1][1][local_4 * 0x40 + local_8] = uVar1;
    }
  }
  return;
}

Assistant:

static inline void init_wedge_master_masks(void) {
  int i, j;
  const int w = MASK_MASTER_SIZE;
  const int h = MASK_MASTER_SIZE;
  const int stride = MASK_MASTER_STRIDE;
  // Note: index [0] stores the masters, and [1] its complement.
  // Generate prototype by shifting the masters
  int shift = h / 4;
  for (i = 0; i < h; i += 2) {
    shift_copy(wedge_master_oblique_even,
               &wedge_mask_obl[0][WEDGE_OBLIQUE63][i * stride], shift,
               MASK_MASTER_SIZE);
    shift--;
    shift_copy(wedge_master_oblique_odd,
               &wedge_mask_obl[0][WEDGE_OBLIQUE63][(i + 1) * stride], shift,
               MASK_MASTER_SIZE);
    memcpy(&wedge_mask_obl[0][WEDGE_VERTICAL][i * stride],
           wedge_master_vertical,
           MASK_MASTER_SIZE * sizeof(wedge_master_vertical[0]));
    memcpy(&wedge_mask_obl[0][WEDGE_VERTICAL][(i + 1) * stride],
           wedge_master_vertical,
           MASK_MASTER_SIZE * sizeof(wedge_master_vertical[0]));
  }

  for (i = 0; i < h; ++i) {
    for (j = 0; j < w; ++j) {
      const int msk = wedge_mask_obl[0][WEDGE_OBLIQUE63][i * stride + j];
      wedge_mask_obl[0][WEDGE_OBLIQUE27][j * stride + i] = msk;
      wedge_mask_obl[0][WEDGE_OBLIQUE117][i * stride + w - 1 - j] =
          wedge_mask_obl[0][WEDGE_OBLIQUE153][(w - 1 - j) * stride + i] =
              (1 << WEDGE_WEIGHT_BITS) - msk;
      wedge_mask_obl[1][WEDGE_OBLIQUE63][i * stride + j] =
          wedge_mask_obl[1][WEDGE_OBLIQUE27][j * stride + i] =
              (1 << WEDGE_WEIGHT_BITS) - msk;
      wedge_mask_obl[1][WEDGE_OBLIQUE117][i * stride + w - 1 - j] =
          wedge_mask_obl[1][WEDGE_OBLIQUE153][(w - 1 - j) * stride + i] = msk;
      const int mskx = wedge_mask_obl[0][WEDGE_VERTICAL][i * stride + j];
      wedge_mask_obl[0][WEDGE_HORIZONTAL][j * stride + i] = mskx;
      wedge_mask_obl[1][WEDGE_VERTICAL][i * stride + j] =
          wedge_mask_obl[1][WEDGE_HORIZONTAL][j * stride + i] =
              (1 << WEDGE_WEIGHT_BITS) - mskx;
    }
  }
}